

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O1

void Ssc_ManStartSolver(Ssc_Man_t *p)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pGVar3;
  uint *puVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  Vec_Int_t *pVVar8;
  uint *__s;
  Vec_Int_t *pVVar9;
  int *__s_00;
  sat_solver *s;
  int iVar10;
  long lVar11;
  int iObj;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  pAig = Gia_ManToAigSimple(p->pFraig);
  p_00 = Cnf_Derive(pAig,0);
  if ((p->pSat != (sat_solver *)0x0) || (p->vId2Var != (Vec_Int_t *)0x0)) {
    __assert_fail("p->pSat == NULL && p->vId2Var == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                  ,0x10c,"void Ssc_ManStartSolver(Ssc_Man_t *)");
  }
  if (pAig->vObjs->nSize != p->pFraig->nObjs) {
    __assert_fail("Aig_ManObjNumMax(pMan) == Gia_ManObjNum(p->pFraig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                  ,0x10d,"void Ssc_ManStartSolver(Ssc_Man_t *)");
  }
  Aig_ManStop(pAig);
  iVar7 = p_00->nVars;
  p->nSatVars = iVar7;
  p->nSatVarsPivot = iVar7;
  pGVar2 = p->pAig;
  pGVar3 = p->pCare;
  iVar10 = pGVar2->nObjs - pGVar2->vCos->nSize;
  iVar15 = pGVar3->nObjs - pGVar3->vCos->nSize;
  iVar13 = iVar15 + iVar10 + 8;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar15 + iVar10 + 7U) {
    iVar7 = iVar13;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (uint *)0x0;
  }
  else {
    __s = (uint *)malloc((long)iVar7 << 2);
  }
  pVVar8->pArray = (int *)__s;
  pVVar8->nSize = iVar13;
  if (__s != (uint *)0x0) {
    memset(__s,0,(long)iVar13 << 2);
  }
  p->vId2Var = pVVar8;
  iVar10 = pGVar2->nObjs - pGVar2->vCos->nSize;
  iVar15 = pGVar3->nObjs - pGVar3->vCos->nSize;
  iVar14 = iVar10 + iVar15 + 8;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar10 + iVar15 + 7U) {
    iVar7 = iVar14;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar7;
  if (iVar7 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar7 << 2);
  }
  pVVar9->pArray = __s_00;
  pVVar9->nSize = iVar14;
  if (__s_00 != (int *)0x0) {
    memset(__s_00,0,(long)iVar14 << 2);
  }
  p->vVar2Id = pVVar9;
  if (0 < iVar13) {
    puVar4 = (uint *)p_00->pVarNums;
    uVar1 = *puVar4;
    *__s = uVar1;
    if ((-1 < (int)uVar1) && ((int)uVar1 < iVar14)) {
      __s_00[uVar1] = 0;
      pGVar2 = p->pFraig;
      pVVar5 = pGVar2->vCis;
      if (0 < pVVar5->nSize) {
        piVar6 = pVVar5->pArray;
        lVar11 = 0;
        do {
          iVar7 = piVar6[lVar11];
          lVar12 = (long)iVar7;
          if ((lVar12 < 0) || (pGVar2->nObjs <= iVar7)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar2->pObjs == (Gia_Obj_t *)0x0) break;
          if (pVVar8->nSize <= iVar7) goto LAB_0063836a;
          uVar1 = puVar4[lVar12];
          __s[lVar12] = uVar1;
          if (((int)uVar1 < 0) || (pVVar9->nSize <= (int)uVar1)) goto LAB_0063836a;
          __s_00[uVar1] = iVar7;
          lVar11 = lVar11 + 1;
        } while (lVar11 < pVVar5->nSize);
      }
      s = sat_solver_new();
      sat_solver_setnvars(s,p_00->nVars + 1000);
      lVar11 = 0;
      do {
        if (p_00->nClauses <= lVar11) {
          Cnf_DataFree(p_00);
          iVar7 = sat_solver_simplify(s);
          if (iVar7 != 0) {
            p->pSat = s;
            return;
          }
          goto LAB_00638354;
        }
        iVar7 = sat_solver_addclause(s,p_00->pClauses[lVar11],p_00->pClauses[lVar11 + 1]);
        lVar11 = lVar11 + 1;
      } while (iVar7 != 0);
      Cnf_DataFree(p_00);
LAB_00638354:
      sat_solver_delete(s);
      return;
    }
  }
LAB_0063836a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Ssc_ManStartSolver( Ssc_Man_t * p )
{
    Aig_Man_t * pMan = Gia_ManToAigSimple( p->pFraig );
    Cnf_Dat_t * pDat = Cnf_Derive( pMan, 0 );
    Gia_Obj_t * pObj;
    sat_solver * pSat;
    int i, status;
    assert( p->pSat == NULL && p->vId2Var == NULL );
    assert( Aig_ManObjNumMax(pMan) == Gia_ManObjNum(p->pFraig) );
    Aig_ManStop( pMan );
    // save variable mapping
    p->nSatVarsPivot = p->nSatVars = pDat->nVars;
    p->vId2Var = Vec_IntStart( Gia_ManCandNum(p->pAig) + Gia_ManCandNum(p->pCare) + 10 ); // mapping of each node into its SAT var
    p->vVar2Id = Vec_IntStart( Gia_ManCandNum(p->pAig) + Gia_ManCandNum(p->pCare) + 10 ); // mapping of each SAT var into its node
    Ssc_ObjSetSatVar( p, 0, pDat->pVarNums[0] );
    Gia_ManForEachCi( p->pFraig, pObj, i )
    {
        int iObj = Gia_ObjId( p->pFraig, pObj );
        Ssc_ObjSetSatVar( p, iObj, pDat->pVarNums[iObj] );
    }
//Cnf_DataWriteIntoFile( pDat, "dump.cnf", 1, NULL, NULL );
    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pDat->nVars + 1000 );
    for ( i = 0; i < pDat->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pDat->pClauses[i], pDat->pClauses[i+1] ) )
        {
            Cnf_DataFree( pDat );
            sat_solver_delete( pSat );
            return;
        }
    }
    Cnf_DataFree( pDat );
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        return;
    }
    p->pSat = pSat;
}